

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_parser.cpp
# Opt level: O0

void __thiscall BmsParser::Parser::ParseMeasure(Parser *this,char *str)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  BmsBarManager *this_00;
  double l;
  double value_;
  char *value_s_;
  allocator local_41;
  string local_40 [32];
  uint local_20;
  int local_1c;
  int bar_;
  int channel;
  char *str_local;
  Parser *this_local;
  
  _bar_ = str;
  str_local = (char *)this;
  bVar1 = anon_unknown_2::IsBar(str);
  if ((bVar1) && (local_1c = atoi(_bar_ + 3), pcVar3 = _bar_, local_1c == 2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,pcVar3,3,&local_41);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    uVar2 = atoi(pcVar3);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    local_20 = uVar2;
    pcVar3 = anon_unknown_2::ParseColon(_bar_);
    if (pcVar3 == (char *)0x0) {
      WriteLogLine(this,"line %d - cannot parse measure length (%s)",(ulong)(uint)this->line_,_bar_)
      ;
    }
    else {
      pcVar3 = anon_unknown_2::Trim(pcVar3);
      l = atof(pcVar3);
      this_00 = BmsBms::GetBarManager(this->bms_);
      BmsBarManager::SetRatio(this_00,local_20,l,true);
    }
  }
  return;
}

Assistant:

void Parser::ParseMeasure(const char* str)
	{
		if (!IsBar(str)) return;
		// if channel isn't 02(BAR channel)
		// then ignore
		int channel = atoi(str + 3);
		if (channel != 2) return;
		int bar_ = atoi(std::string(str, 3).c_str());
		const char* value_s_ = ParseColon(str);
		if (!value_s_) {
			WriteLogLine("line %d - cannot parse measure length (%s)", line_, str);
			return;
		}
		double value_ = atof(Trim(value_s_));
		bms_.GetBarManager().SetRatio(bar_, value_);
	}